

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBufferToImage::ReadImplementation::recordCommands
          (ReadImplementation *this,VkCommandBuffer cmdBuffer)

{
  DeviceInterface *pDVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  VkBufferMemoryBarrier barrier;
  VkBufferImageCopy copyRegion;
  VkImageMemoryBarrier layoutBarrier;
  
  pDVar1 = this->m_context->m_vk;
  makeBufferImageCopy(&copyRegion,this->m_subresourceLayers,this->m_imageExtent);
  makeImageMemoryBarrier
            (&layoutBarrier,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             (VkImage)(((this->m_image).
                        super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,this->m_subresourceRange);
  uVar2 = SUB84(&layoutBarrier,0);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,1,0x1000,0,0,0,0,0,1,uVar2);
  uVar3 = SUB84(&copyRegion,0);
  (*pDVar1->_vptr_DeviceInterface[0x62])
            (pDVar1,cmdBuffer,(this->m_resource->m_bufferData).handle.m_internal,
             (deUint64)
             (((this->m_image).
               super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object,7,
             1,uVar3);
  makeImageMemoryBarrier
            (&layoutBarrier,0x1000,0x800,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)(((this->m_image).
                        super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,this->m_subresourceRange);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x1000,0x1000,0,0,0,0,0,1,uVar2);
  (*pDVar1->_vptr_DeviceInterface[99])
            (pDVar1,cmdBuffer,
             (deUint64)
             (((this->m_image).
               super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object,6,
             (deUint64)
             (((this->m_hostBuffer).
               super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object,1
             ,uVar3);
  makeBufferMemoryBarrier
            (&barrier,0x1000,0x2000,
             (VkBuffer)
             (((this->m_hostBuffer).
               super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,(this->m_resource->m_bufferData).size);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x1000,0x4000,0,0,0,1,&barrier,0,0);
  return;
}

Assistant:

void recordCommands (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk			= m_context.getDeviceInterface();
		const VkBufferImageCopy	copyRegion	= makeBufferImageCopy(m_subresourceLayers, m_imageExtent);

		// Resource -> Image
		{
			const VkImageMemoryBarrier layoutBarrier = makeImageMemoryBarrier(
				(VkAccessFlags)0, VK_ACCESS_TRANSFER_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
				**m_image, m_subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 0u, DE_NULL, 1u, &layoutBarrier);

			vk.cmdCopyBufferToImage(cmdBuffer, m_resource.getBuffer().handle, **m_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyRegion);
		}
		// Image -> Host buffer
		{
			const VkImageMemoryBarrier layoutBarrier = makeImageMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				**m_image, m_subresourceRange);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 0u, DE_NULL, 1u, &layoutBarrier);

			vk.cmdCopyImageToBuffer(cmdBuffer, **m_image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **m_hostBuffer, 1u, &copyRegion);

			const VkBufferMemoryBarrier	barrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **m_hostBuffer, 0u, m_resource.getBuffer().size);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}
	}